

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::BasicResetCase::passAndLog
          (BasicResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  GLint GVar1;
  ContextReset *pCVar2;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_1e0;
  GetNameFunc local_1d0;
  int local_1c8;
  Enum<int,_2UL> local_1c0 [2];
  MessageBuilder local_1a0;
  GLint local_1c;
  SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *pSStack_18;
  GLint status;
  SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset_local;
  BasicResetCase *this_local;
  
  pSStack_18 = contextReset;
  contextReset_local = (SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *)this;
  pCVar2 = de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::operator->(contextReset);
  local_1c = ContextReset::getGraphicsResetStatus(pCVar2);
  if (local_1c == 0) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.
                         super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1a0,
                        (char (*) [63])
                        "Test failed! glGetGraphicsResetStatus() returned wrong value [");
    EVar4 = glu::getGraphicsResetStatusStr(local_1c);
    local_1d0 = EVar4.m_getName;
    local_1c8 = EVar4.m_value;
    local_1c0[0].m_getName = local_1d0;
    local_1c0[0].m_value = local_1c8;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2c24a65);
    EVar4 = glu::getGraphicsResetStatusStr(0x8253);
    local_1e0.m_getName = EVar4.m_getName;
    local_1e0.m_value = EVar4.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1e0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x29ea7ce);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    tcu::TestContext::setTestResult
              ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase
               .super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
  }
  else {
    pCVar2 = de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::operator->(pSStack_18);
    GVar1 = ContextReset::getError(pCVar2);
    if (GVar1 == 0) {
      tcu::TestContext::setTestResult
                ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.
                 super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.
                 super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Error flag not reset after calling getGraphicsResetStatus()");
    }
  }
  return;
}

Assistant:

virtual void passAndLog (de::SharedPtr<ContextReset>& contextReset)
	{
		const glw::GLint status = contextReset->getGraphicsResetStatus();

		if (status == GL_NO_ERROR)
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message
								<< "Test failed! glGetGraphicsResetStatus() returned wrong value [" << glu::getGraphicsResetStatusStr(status) << ", expected " << glu::getGraphicsResetStatusStr(GL_GUILTY_CONTEXT_RESET) << "]"
								<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
		else
		{
			if (contextReset->getError() != GL_NO_ERROR)
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Error flag not reset after calling getGraphicsResetStatus()");
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
	}